

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O0

node * remhead(list *l)

{
  node *n;
  list *l_local;
  node *local_8;
  
  local_8 = l->first;
  if (local_8->next == (node *)0x0) {
    local_8 = (node *)0x0;
  }
  else {
    l->first = local_8->next;
    local_8->next->pred = local_8->pred;
  }
  return local_8;
}

Assistant:

struct node *remhead(struct list *l)
/* remove first node in list and return a pointer to it */
{
  struct node *n = l->first;

  if (n->next) {
    l->first = n->next;
    n->next->pred = n->pred;
    return n;
  }
  return NULL;
}